

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

Num * __thiscall Num::createNumber(Num *__return_storage_ptr__,Num *this,Short k)

{
  ushort uVar1;
  uint uVar2;
  uniform_int_distribution<int> d2_1;
  uniform_int_distribution<int> d2;
  string a;
  mt19937 gen;
  random_device rd;
  
  std::random_device::random_device(&rd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar2);
  a._M_dataplus._M_p = (pointer)&a.field_2;
  a._M_string_length = 0;
  a.field_2._M_local_buf[0] = '\0';
  if (k == 1) {
    d2._M_param._M_a = 0;
    d2._M_param._M_b = 9;
    std::uniform_int_distribution<int>::operator()(&d2,&gen);
    std::__cxx11::string::push_back((char)&a);
  }
  else {
    d2._M_param._M_a = 1;
    d2._M_param._M_b = 9;
    d2_1._M_param._M_a = 0;
    d2_1._M_param._M_b = 9;
    uVar1 = 1;
    if (1 < k) {
      uVar1 = k;
    }
    uVar2 = (uint)uVar1;
    while (uVar2 = uVar2 - 1, uVar2 != 0) {
      std::uniform_int_distribution<int>::operator()(&d2,&gen);
      std::__cxx11::string::push_back((char)&a);
    }
    std::uniform_int_distribution<int>::operator()(&d2_1,&gen);
    std::__cxx11::string::push_back((char)&a);
  }
  Num(__return_storage_ptr__,&a,k);
  std::__cxx11::string::~string((string *)&a);
  std::random_device::~random_device(&rd);
  return __return_storage_ptr__;
}

Assistant:

Num Num::createNumber(Short k)
{

    std::random_device rd;
    std::mt19937 gen(rd());
    std::string a;

    if (k == 1)
    {
        std::uniform_int_distribution<> d2(0, 9);
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    else
    {
        std::uniform_int_distribution<> d1(1, 9);
        std::uniform_int_distribution<> d2(0, 9);
        for (int i = 0; i < k - 1; ++i)
        {
            a.push_back(static_cast<char>(48 + d1(gen)));
        }
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    Num number(a, k);

    return number;
}